

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O0

void __thiscall mocker::Annotator::operator()(Annotator *this,VarDeclStmt *node)

{
  SemanticContext *pSVar1;
  unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
  *puVar2;
  bool bVar3;
  element_type *peVar4;
  mapped_type *pmVar5;
  element_type *peVar6;
  mapped_type *this_00;
  mapped_type *pmVar7;
  mapped_type *this_01;
  DuplicatedSymbols *this_02;
  NodeID local_a0;
  shared_ptr<mocker::ast::Declaration> local_98;
  undefined1 local_81;
  NodeID NStack_80;
  bool addRes;
  NodeID local_78;
  NodeID local_70;
  NodeID local_68;
  NodeID local_60 [3];
  enable_shared_from_this<mocker::ast::ASTNode> local_48;
  shared_ptr<mocker::ast::ASTNode> local_38;
  undefined1 local_28 [8];
  shared_ptr<mocker::ast::VarDecl> decl;
  VarDeclStmt *node_local;
  Annotator *this_local;
  
  decl.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  checkVarDecl(this,node);
  std::enable_shared_from_this<mocker::ast::ASTNode>::shared_from_this(&local_48);
  std::static_pointer_cast<mocker::ast::VarDeclStmt,mocker::ast::ASTNode>(&local_38);
  std::make_shared<mocker::ast::VarDecl,std::shared_ptr<mocker::ast::VarDeclStmt>>
            ((shared_ptr<mocker::ast::VarDeclStmt> *)local_28);
  std::shared_ptr<mocker::ast::VarDeclStmt>::~shared_ptr
            ((shared_ptr<mocker::ast::VarDeclStmt> *)&local_38);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr((shared_ptr<mocker::ast::ASTNode> *)&local_48);
  pSVar1 = this->ctx;
  peVar4 = std::__shared_ptr_access<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  local_60[0] = ast::ASTNode::getID((ASTNode *)peVar4);
  pmVar5 = std::
           unordered_map<unsigned_long,_mocker::ScopeID,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_mocker::ScopeID>_>_>
           ::operator[](&pSVar1->scopeResiding,local_60);
  ScopeID::operator=(pmVar5,&this->scopeResiding);
  pSVar1 = this->ctx;
  local_68 = ast::ASTNode::getID((ASTNode *)
                                 decl.
                                 super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
  pmVar5 = std::
           unordered_map<unsigned_long,_mocker::ScopeID,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_mocker::ScopeID>_>_>
           ::operator[](&pSVar1->scopeResiding,&local_68);
  ScopeID::operator=(pmVar5,&this->scopeResiding);
  pSVar1 = this->ctx;
  peVar6 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&decl.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[2]._M_use_count);
  local_70 = ast::ASTNode::getID(&peVar6->super_ASTNode);
  this_00 = std::
            unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Declaration>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>_>
            ::operator[](&pSVar1->associatedDecl,&local_70);
  std::shared_ptr<mocker::ast::Declaration>::operator=
            (this_00,(shared_ptr<mocker::ast::VarDecl> *)local_28);
  puVar2 = this->pos;
  local_78 = ast::ASTNode::getID((ASTNode *)
                                 decl.
                                 super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
  pmVar7 = std::
           unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
           ::operator[](puVar2,&local_78);
  puVar2 = this->pos;
  peVar4 = std::__shared_ptr_access<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  NStack_80 = ast::ASTNode::getID((ASTNode *)peVar4);
  this_01 = std::
            unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
            ::operator[](puVar2,&stack0xffffffffffffff80);
  std::pair<mocker::Position,_mocker::Position>::operator=(this_01,pmVar7);
  pSVar1 = this->ctx;
  peVar6 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&decl.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[2]._M_use_count);
  std::shared_ptr<mocker::ast::Declaration>::shared_ptr<mocker::ast::VarDecl,void>
            (&local_98,(shared_ptr<mocker::ast::VarDecl> *)local_28);
  bVar3 = SymTbl::addSymbol(&pSVar1->syms,&this->scopeResiding,&peVar6->val,&local_98);
  std::shared_ptr<mocker::ast::Declaration>::~shared_ptr(&local_98);
  local_81 = bVar3;
  if (!bVar3) {
    this_02 = (DuplicatedSymbols *)__cxa_allocate_exception(0x68);
    puVar2 = this->pos;
    local_a0 = ast::ASTNode::getID((ASTNode *)
                                   decl.
                                   super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
    pmVar7 = std::
             unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
             ::operator[](puVar2,&local_a0);
    peVar6 = std::
             __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&decl.
                              super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._M_use_count);
    DuplicatedSymbols::DuplicatedSymbols(this_02,pmVar7,&peVar6->val);
    __cxa_throw(this_02,&DuplicatedSymbols::typeinfo,DuplicatedSymbols::~DuplicatedSymbols);
  }
  std::shared_ptr<mocker::ast::VarDecl>::~shared_ptr((shared_ptr<mocker::ast::VarDecl> *)local_28);
  return;
}

Assistant:

void operator()(ast::VarDeclStmt &node) const override {
    checkVarDecl(node);
    auto decl = std::make_shared<ast::VarDecl>(
        std::static_pointer_cast<ast::VarDeclStmt>(node.shared_from_this()));
    ctx.scopeResiding[decl->getID()] = scopeResiding;
    ctx.scopeResiding[node.getID()] = scopeResiding;
    ctx.associatedDecl[node.identifier->getID()] = decl;
    pos[decl->getID()] = pos[node.getID()];
    bool addRes = ctx.syms.addSymbol(scopeResiding, node.identifier->val, decl);

    if (!addRes)
      throw DuplicatedSymbols(pos[node.getID()], node.identifier->val);
  }